

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::loadSettingsFile(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,char *filename)

{
  byte bVar1;
  Verbosity VVar2;
  long *plVar3;
  size_t sVar4;
  char *in_RSI;
  long in_RDI;
  SPxOut *pSVar5;
  Verbosity old_verbosity_3;
  Verbosity old_verbosity_2;
  bool readError;
  int lineNumber;
  char line [500];
  Verbosity old_verbosity_1;
  spxifstream file;
  Verbosity old_verbosity;
  char *in_stack_fffffffffffff9f8;
  SPxOut *in_stack_fffffffffffffa00;
  size_t in_stack_fffffffffffffa28;
  undefined8 in_stack_fffffffffffffa30;
  openmode mode;
  undefined5 in_stack_fffffffffffffa38;
  undefined1 in_stack_fffffffffffffa3d;
  undefined1 in_stack_fffffffffffffa3e;
  undefined1 in_stack_fffffffffffffa3f;
  ifstream *in_stack_fffffffffffffa40;
  Verbosity local_590;
  Verbosity local_58c [3];
  byte local_57d;
  int local_57c;
  char local_578 [276];
  int in_stack_fffffffffffffb9c;
  char *in_stack_fffffffffffffba0;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffba8;
  Verbosity local_37c;
  Verbosity local_378 [5];
  allocator local_361;
  string local_360 [32];
  long local_340 [100];
  Verbosity local_20;
  Verbosity local_1c;
  char *local_18;
  byte local_1;
  
  mode = (openmode)((ulong)in_stack_fffffffffffffa30 >> 0x20);
  local_18 = in_RSI;
  (**(code **)(*(long *)**(undefined8 **)(in_RDI + 0x20) + 0x18))();
  if ((in_RDI != -8) && (VVar2 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8)), 2 < (int)VVar2)) {
    local_1c = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8));
    local_20 = INFO1;
    SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),&local_20);
    soplex::operator<<(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
    soplex::operator<<(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
    soplex::operator<<(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
    SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),&local_1c);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,local_18,&local_361);
  zstr::ifstream::ifstream
            (in_stack_fffffffffffffa40,
             (string *)
             CONCAT17(in_stack_fffffffffffffa3f,
                      CONCAT16(in_stack_fffffffffffffa3e,
                               CONCAT15(in_stack_fffffffffffffa3d,in_stack_fffffffffffffa38))),mode,
             in_stack_fffffffffffffa28);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  bVar1 = std::ios::operator!((void *)((long)local_340 + *(long *)(local_340[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    local_57c = 0;
    local_57d = 0;
    while( true ) {
      local_57c = local_57c + 1;
      plVar3 = (long *)std::istream::getline((char *)local_340,(long)local_578);
      local_57d = std::ios::operator!((void *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
      local_57d = local_57d & 1;
      if (local_57d != 0) break;
      _parseSettingsLine(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
                         in_stack_fffffffffffffb9c);
    }
    bVar1 = 0;
    if (local_57d != 0) {
      bVar1 = std::ios::eof();
      bVar1 = bVar1 ^ 0xff;
    }
    local_57d = bVar1 & 1;
    if ((local_57d == 0) || (sVar4 = strlen(local_578), sVar4 != 499)) {
      if (((local_57d & 1) != 0) &&
         ((in_RDI != -8 && (VVar2 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8)), 2 < (int)VVar2))))
      {
        in_stack_fffffffffffffa00 = (SPxOut *)(in_RDI + 8);
        local_58c[0] = SPxOut::getVerbosity(in_stack_fffffffffffffa00);
        local_590 = INFO1;
        SPxOut::setVerbosity(in_stack_fffffffffffffa00,&local_590);
        soplex::operator<<(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
        pSVar5 = soplex::operator<<(in_stack_fffffffffffffa00,
                                    (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20));
        soplex::operator<<(in_stack_fffffffffffffa00,(char *)pSVar5);
        SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),local_58c);
      }
    }
    else if ((in_RDI != -8) &&
            (VVar2 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8)), 2 < (int)VVar2)) {
      pSVar5 = (SPxOut *)(in_RDI + 8);
      local_58c[2] = SPxOut::getVerbosity(pSVar5);
      local_58c[1] = 3;
      SPxOut::setVerbosity(pSVar5,local_58c + 1);
      soplex::operator<<(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
      soplex::operator<<(in_stack_fffffffffffffa00,(int)((ulong)in_stack_fffffffffffff9f8 >> 0x20));
      soplex::operator<<(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
      soplex::operator<<(in_stack_fffffffffffffa00,(int)((ulong)in_stack_fffffffffffff9f8 >> 0x20));
      soplex::operator<<(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
      SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),local_58c + 2);
    }
    (**(code **)(*(long *)**(undefined8 **)(in_RDI + 0x20) + 0x20))();
    local_1 = (local_57d ^ 0xff) & 1;
  }
  else {
    if ((in_RDI != -8) && (VVar2 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8)), 2 < (int)VVar2)) {
      local_378[0] = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8));
      local_37c = INFO1;
      SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),&local_37c);
      soplex::operator<<(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
      SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),local_378);
    }
    local_1 = 0;
  }
  zstr::ifstream::~ifstream((ifstream *)in_stack_fffffffffffffa00);
  return (bool)(local_1 & 1);
}

Assistant:

bool SoPlexBase<R>::loadSettingsFile(const char* filename)
{
   assert(filename != nullptr);

   // start timing
   _statistics->readingTime->start();

   SPX_MSG_INFO1(spxout, spxout << "Loading settings file <" << filename << "> . . .\n");

   // open file
   spxifstream file(filename);

   if(!file)
   {
      SPX_MSG_INFO1(spxout, spxout << "Error opening settings file.\n");
      return false;
   }

   // read file
   char line[SPX_SET_MAX_LINE_LEN];
   int lineNumber = 0;
   bool readError = false;

   while(true)
   {
      lineNumber++;
      readError = !file.getline(line, sizeof(line));

      if(readError)
         break;

      (void)_parseSettingsLine(line, lineNumber);
   }

   readError = readError && !file.eof();

   if(readError && strlen(line) == SPX_SET_MAX_LINE_LEN - 1)
   {
      SPX_MSG_INFO1(spxout, spxout << "Error reading settings file: line " << lineNumber <<
                    " in settings file exceeds " << SPX_SET_MAX_LINE_LEN - 2 << " characters.\n");
   }
   else if(readError)
   {
      SPX_MSG_INFO1(spxout, spxout << "Error reading settings file: line " << lineNumber << ".\n");
   }

   // stop timing
   _statistics->readingTime->stop();

   return !readError;
}